

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O2

void __thiscall
BoundaryElement::cluster_particle_interact
          (BoundaryElement *this,double *potential,size_t target_node_idx,
          array<unsigned_long,_2UL> source_node_element_idxs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  int iVar8;
  Timers_BoundaryElement *pTVar9;
  Elements *pEVar10;
  InterpolationPoints *pIVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer pdVar14;
  pointer pdVar15;
  pointer pdVar16;
  pointer pdVar17;
  pointer pdVar18;
  pointer pdVar19;
  pointer pdVar20;
  pointer pdVar21;
  pointer pdVar22;
  pointer pdVar23;
  pointer pdVar24;
  pointer pdVar25;
  rep rVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  size_t k;
  ulong uVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  
  pTVar9 = this->timers_;
  rVar26 = std::chrono::_V2::steady_clock::now();
  (pTVar9->cluster_particle_interact).start_time_.__d.__r = rVar26;
  pEVar10 = this->elements_;
  pIVar11 = this->interp_pts_;
  uVar7 = pIVar11->num_interp_pts_per_node_;
  iVar8 = this->num_charges_per_node_;
  lVar32 = (long)(int)uVar7 * target_node_idx;
  dVar1 = this->params_->phys_eps_;
  dVar2 = this->params_->phys_kappa_;
  pdVar12 = (pEVar10->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pdVar13 = (pEVar10->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pdVar14 = (pEVar10->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pdVar15 = (pEVar10->source_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar16 = (pEVar10->source_charge_dx_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  pdVar17 = (pEVar10->source_charge_dy_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  pdVar18 = (pEVar10->source_charge_dz_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  pdVar19 = (pIVar11->interp_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar20 = (pIVar11->interp_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar21 = (pIVar11->interp_z_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar27 = 0;
  if (0 < (int)uVar7) {
    uVar27 = (ulong)uVar7;
  }
  pdVar22 = (this->interp_potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar23 = (this->interp_potential_dx_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  pdVar24 = (this->interp_potential_dy_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  pdVar25 = (this->interp_potential_dz_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  for (uVar29 = 0; uVar29 != uVar27; uVar29 = uVar29 + 1) {
    for (uVar30 = 0; uVar30 != uVar7; uVar30 = uVar30 + 1) {
      for (uVar31 = 0; uVar31 != uVar7; uVar31 = uVar31 + 1) {
        dVar3 = pdVar19[lVar32 + uVar29];
        dVar4 = pdVar20[lVar32 + uVar30];
        dVar5 = pdVar21[lVar32 + uVar31];
        dVar38 = 0.0;
        dVar42 = 0.0;
        dVar43 = 0.0;
        dVar45 = 0.0;
        for (uVar33 = source_node_element_idxs._M_elems[0];
            uVar33 < source_node_element_idxs._M_elems[1]; uVar33 = uVar33 + 1) {
          dVar47 = dVar3 - pdVar12[uVar33];
          dVar34 = dVar4 - pdVar13[uVar33];
          dVar35 = dVar5 - pdVar14[uVar33];
          dVar50 = dVar47 * dVar47 + dVar34 * dVar34 + dVar35 * dVar35;
          dVar49 = SQRT(dVar50);
          dVar36 = 1.0 / dVar49;
          dVar46 = dVar36 * dVar36 * dVar36;
          dVar37 = exp(dVar49 * -dVar2);
          dVar48 = dVar2 * dVar49 + 1.0;
          dVar39 = dVar37 * dVar46 * dVar48;
          dVar40 = dVar39 / dVar1 - dVar46;
          dVar53 = ((dVar50 * dVar2 * dVar2 + dVar49 * dVar2 * 3.0 + 3.0) * dVar37 + -3.0) *
                   dVar36 * dVar46 * dVar36;
          dVar44 = (1.0 - dVar48 * dVar37) * dVar46;
          dVar48 = pdVar16[uVar33];
          dVar49 = pdVar17[uVar33];
          dVar50 = pdVar18[uVar33];
          dVar54 = dVar47 * dVar34 * dVar53;
          dVar52 = dVar34 * dVar35 * dVar53;
          dVar51 = dVar47 * dVar35 * dVar53;
          dVar6 = pdVar15[uVar33];
          dVar41 = dVar40 * dVar6;
          dVar38 = dVar38 + (dVar41 * dVar35 -
                            ((dVar53 * dVar35 * dVar35 + dVar44) * dVar50 +
                            dVar51 * dVar48 + dVar52 * dVar49));
          dVar42 = dVar42 + (dVar34 * dVar41 -
                            (dVar50 * dVar52 +
                            dVar54 * dVar48 + (dVar34 * dVar34 * dVar53 + dVar44) * dVar49));
          dVar43 = dVar43 + dVar6 * dVar47 * dVar40 +
                            -(dVar50 * dVar51 +
                             (dVar47 * dVar47 * dVar53 + dVar44) * dVar48 + dVar49 * dVar54);
          dVar45 = dVar45 + dVar6 * (1.0 - dVar37) * dVar36 +
                            (dVar50 * dVar35 + dVar48 * dVar47 + dVar34 * dVar49) *
                            (dVar39 * dVar1 - dVar46);
        }
        lVar28 = uVar30 * (long)(int)uVar7 +
                 (long)(int)(uVar7 * uVar7 * (int)uVar29) + (long)iVar8 * target_node_idx + uVar31;
        pdVar22[lVar28] = dVar45 + pdVar22[lVar28];
        pdVar23[lVar28] = dVar43 + pdVar23[lVar28];
        pdVar24[lVar28] = dVar42 + pdVar24[lVar28];
        pdVar25[lVar28] = dVar38 + pdVar25[lVar28];
      }
    }
  }
  Timer::stop(&this->timers_->cluster_particle_interact);
  return;
}

Assistant:

void BoundaryElement::cluster_particle_interact(double* __restrict potential,
                                         std::size_t target_node_idx,
                                         std::array<std::size_t, 2> source_node_element_idxs)
{
    timers_.cluster_particle_interact.start();

    int num_interp_pts_per_node = interp_pts_.num_interp_pts_per_node();
    int num_potentials_per_node = num_charges_per_node_;
    
    std::size_t target_cluster_interp_pts_begin = target_node_idx * num_interp_pts_per_node;
    std::size_t target_cluster_potentials_begin = target_node_idx * num_potentials_per_node;

    std::size_t source_node_element_begin       = source_node_element_idxs[0];
    std::size_t source_node_element_end         = source_node_element_idxs[1];
    
    double eps    = params_.phys_eps_;
    double kappa  = params_.phys_kappa_;
    
    const double* __restrict clusters_x_ptr    = interp_pts_.interp_x_ptr();
    const double* __restrict clusters_y_ptr    = interp_pts_.interp_y_ptr();
    const double* __restrict clusters_z_ptr    = interp_pts_.interp_z_ptr();
    
    double* __restrict clusters_p_ptr          = interp_potential_.data();
    double* __restrict clusters_p_dx_ptr       = interp_potential_dx_.data();
    double* __restrict clusters_p_dy_ptr       = interp_potential_dy_.data();
    double* __restrict clusters_p_dz_ptr       = interp_potential_dz_.data();
    
    const double* __restrict elements_x_ptr    = elements_.x_ptr();
    const double* __restrict elements_y_ptr    = elements_.y_ptr();
    const double* __restrict elements_z_ptr    = elements_.z_ptr();
    
    const double* __restrict sources_q_ptr     = elements_.source_charge_ptr();
    const double* __restrict sources_q_dx_ptr  = elements_.source_charge_dx_ptr();
    const double* __restrict sources_q_dy_ptr  = elements_.source_charge_dy_ptr();
    const double* __restrict sources_q_dz_ptr  = elements_.source_charge_dz_ptr();
    
#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop collapse(3) async(stream_id) present(clusters_x_ptr, clusters_y_ptr, clusters_z_ptr, \
                    clusters_p_ptr, clusters_p_dx_ptr, clusters_p_dy_ptr, clusters_p_dz_ptr, \
                    elements_x_ptr, elements_y_ptr, elements_z_ptr, \
                    sources_q_ptr, sources_q_dx_ptr, sources_q_dy_ptr, sources_q_dz_ptr, \
                    potential)
#endif
    for (int j1 = 0; j1 < num_interp_pts_per_node; ++j1) {
    for (int j2 = 0; j2 < num_interp_pts_per_node; ++j2) {
    for (int j3 = 0; j3 < num_interp_pts_per_node; ++j3) {
    
        std::size_t jj = target_cluster_potentials_begin
                       + j1 * num_interp_pts_per_node * num_interp_pts_per_node
                       + j2 * num_interp_pts_per_node + j3;

        double target_x = clusters_x_ptr[target_cluster_interp_pts_begin + j1];
        double target_y = clusters_y_ptr[target_cluster_interp_pts_begin + j2];
        double target_z = clusters_z_ptr[target_cluster_interp_pts_begin + j3];
        
        double pot_comp_   = 0.;
        double pot_comp_dx = 0.;
        double pot_comp_dy = 0.;
        double pot_comp_dz = 0.;
    
#ifdef OPENACC_ENABLED
        #pragma acc loop reduction(+:pot_comp_,   pot_comp_dx, \
                                     pot_comp_dy, pot_comp_dz)
#endif
        for (std::size_t k = source_node_element_begin; k < source_node_element_end; ++k) {

            double dx = target_x - elements_x_ptr[k];
            double dy = target_y - elements_y_ptr[k];
            double dz = target_z - elements_z_ptr[k];

            double r2    = dx*dx + dy*dy + dz*dz;
            double r     = std::sqrt(r2);
            double rinv  = 1. / r;
            double r3inv = rinv  * rinv * rinv;
            double r5inv = r3inv * rinv * rinv;

            double expkr   =  std::exp(-kappa * r);
            double d1term  =  r3inv * expkr * (1. + (kappa * r));
            double d1term1 = -r3inv + d1term * eps;
            double d1term2 = -r3inv + d1term / eps;
            double d2term  =  r5inv * (-3. + expkr * (3. + (3. * kappa * r)
                                                   + (kappa * kappa * r2)));
            double d3term  =  r3inv * ( 1. - expkr * (1. + kappa * r));

            pot_comp_    += (rinv * (1. - expkr) * (sources_q_ptr   [k])
                                      + d1term1 * (sources_q_dx_ptr[k] * dx
                                                 + sources_q_dy_ptr[k] * dy
                                                 + sources_q_dz_ptr[k] * dz));
                                    
            pot_comp_dx  += (sources_q_ptr   [k]  * (d1term2 * dx)
                          - (sources_q_dx_ptr[k]  * (dx * dx * d2term + d3term)
                          +  sources_q_dy_ptr[k]  * (dx * dy * d2term)
                          +  sources_q_dz_ptr[k]  * (dx * dz * d2term)));
                         
            pot_comp_dy  += (sources_q_ptr   [k]  *  d1term2 * dy
                          - (sources_q_dx_ptr[k]  * (dx * dy * d2term)
                          +  sources_q_dy_ptr[k]  * (dy * dy * d2term + d3term)
                          +  sources_q_dz_ptr[k]  * (dy * dz * d2term)));
                         
            pot_comp_dz  += (sources_q_ptr   [k]  *  d1term2 * dz
                          - (sources_q_dx_ptr[k]  * (dx * dz * d2term)
                          +  sources_q_dy_ptr[k]  * (dy * dz * d2term)
                          +  sources_q_dz_ptr[k]  * (dz * dz * d2term + d3term)));
        }
    
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_ptr   [jj] += pot_comp_;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_dx_ptr[jj] += pot_comp_dx;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_dy_ptr[jj] += pot_comp_dy;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        clusters_p_dz_ptr[jj] += pot_comp_dz;
    }
    }
    }

    timers_.cluster_particle_interact.stop();
}